

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

double loguru::log(double __x)

{
  char in_AL;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  Verbosity in_EDI;
  double extraout_XMM0_Qa;
  Text buff;
  va_list vlist;
  char *local_100;
  __va_list_tag local_f8;
  undefined1 local_d8 [48];
  double local_a8;
  
  local_f8.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = __x;
  }
  local_f8.overflow_arg_area = &buff;
  local_f8.gp_offset = 0x20;
  local_f8.fp_offset = 0x30;
  vtextprintf((loguru *)&local_100,in_RCX,&local_f8);
  log_to_everywhere(1,in_EDI,in_RSI,in_EDX,"",local_100);
  free(local_100);
  return extraout_XMM0_Qa;
}

Assistant:

void log(Verbosity verbosity, const char* file, unsigned line, const char* format, ...)
	{
		va_list vlist;
		va_start(vlist, format);
		auto buff = vtextprintf(format, vlist);
		log_to_everywhere(1, verbosity, file, line, "", buff.c_str());
		va_end(vlist);
	}